

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

void ReadColorMap(gif_source_ptr sinfo,int cmaplen,JSAMPARRAY cmap)

{
  long *plVar1;
  int iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  int in_ESI;
  int i;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  plVar1 = (long *)CONCAT71(in_register_00000011,in_DL);
  for (iVar3 = 0; iVar3 < in_ESI; iVar3 = iVar3 + 1) {
    iVar2 = ReadByte((gif_source_ptr)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    *(char *)(*plVar1 + (long)iVar3) = (char)iVar2;
    iVar2 = ReadByte((gif_source_ptr)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    *(char *)(plVar1[1] + (long)iVar3) = (char)iVar2;
    iVar2 = ReadByte((gif_source_ptr)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
    *(char *)(plVar1[2] + (long)iVar3) = (char)iVar2;
  }
  return;
}

Assistant:

LOCAL(void)
ReadColorMap(gif_source_ptr sinfo, int cmaplen, JSAMPARRAY cmap)
/* Read a GIF colormap */
{
  int i;

  for (i = 0; i < cmaplen; i++) {
#if BITS_IN_JSAMPLE == 8
#define UPSCALE(x)  (x)
#else
#define UPSCALE(x)  ((x) << (BITS_IN_JSAMPLE - 8))
#endif
    cmap[CM_RED][i]   = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_GREEN][i] = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_BLUE][i]  = (JSAMPLE)UPSCALE(ReadByte(sinfo));
  }
}